

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

Graph * __thiscall Graph::returnCopy(Graph *this)

{
  bool swit;
  int iVar1;
  int destinyID;
  int id;
  Graph *this_00;
  Vertex *pVVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Edge *local_80;
  Edge *e;
  Vertex *v;
  Vertex *source;
  Vertex *no;
  double voltage;
  double reactivePower;
  double activePower;
  double react;
  double resist;
  int vertexId;
  int edgeId;
  int destinyId;
  int originId;
  Graph *g;
  Graph *this_local;
  
  this_00 = (Graph *)operator_new(0x88);
  Graph(this_00);
  for (source = Vertex::getNext(this->verticesList); source != (Vertex *)0x0;
      source = Vertex::getNext(source)) {
    iVar1 = Vertex::getID(source);
    dVar3 = Vertex::getActivePower(source);
    dVar4 = Vertex::getReactivePower(source);
    dVar5 = Vertex::getVoltage(source);
    insertVertex(this_00,iVar1,dVar3,dVar4,dVar5,1);
  }
  pVVar2 = this->verticesList;
  iVar1 = Vertex::getID(pVVar2);
  dVar3 = Vertex::getActivePower(pVVar2);
  dVar4 = Vertex::getReactivePower(pVVar2);
  dVar5 = Vertex::getVoltage(pVVar2);
  insertVertex(this_00,iVar1,dVar3,dVar4,dVar5,1);
  for (e = (Edge *)this->verticesList; e != (Edge *)0x0; e = (Edge *)Vertex::getNext((Vertex *)e)) {
    for (local_80 = Vertex::getEdgesList((Vertex *)e); local_80 != (Edge *)0x0;
        local_80 = Edge::getNext(local_80)) {
      pVVar2 = Edge::getOrigin(local_80);
      iVar1 = Vertex::getID(pVVar2);
      pVVar2 = Edge::getDestiny(local_80);
      destinyID = Vertex::getID(pVVar2);
      id = Edge::getID(local_80);
      dVar3 = Edge::getResistance(local_80);
      dVar4 = Edge::getReactance(local_80);
      swit = Edge::isClosed(local_80);
      insertEdge(this_00,iVar1,destinyID,id,dVar3,dVar4,swit);
    }
  }
  return this_00;
}

Assistant:

Graph *Graph::returnCopy(){
    Graph *g = new Graph();
    int originId, destinyId, edgeId, vertexId;
    double resist, react, activePower, reactivePower, voltage;

    for(Vertex *no= this->verticesList->getNext(); no!=NULL; no= no->getNext()){
        vertexId = no->getID();
        activePower = no->getActivePower();
        reactivePower = no->getReactivePower();
        voltage = no->getVoltage();

        g->insertVertex(vertexId, activePower, reactivePower, voltage);
    }

    //inserindo no fonte por ultimo pos a funcao que insere nós insere sempre no inicio da lista, assim o nó fonte fica no inicio da lista
    Vertex *source = this->verticesList;
    g->insertVertex(source->getID(), source->getActivePower(), source->getReactivePower(), source->getVoltage());

    for(Vertex *v=this->verticesList; v!=NULL; v= v->getNext()){
         for(Edge *e= v->getEdgesList(); e!=NULL; e= e->getNext()){
            originId = e->getOrigin()->getID();
            destinyId = e->getDestiny()->getID();
            edgeId = e->getID();
            resist = e->getResistance();
            react = e->getReactance();

             g->insertEdge(originId, destinyId, edgeId, resist, react, e->isClosed());
        }
    }
    return g;
}